

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameWalkTrigger(Walker *pWalker,Trigger *pTrigger)

{
  SrcList *pSVar1;
  int local_2c;
  int i;
  Upsert *pUpsert;
  TriggerStep *pStep;
  Trigger *pTrigger_local;
  Walker *pWalker_local;
  
  sqlite3WalkExpr(pWalker,pTrigger->pWhen);
  for (pUpsert = (Upsert *)pTrigger->step_list; pUpsert != (Upsert *)0x0;
      pUpsert = *(Upsert **)&pUpsert->iIdxCur) {
    sqlite3WalkSelect(pWalker,(Select *)pUpsert->pUpsertSet);
    sqlite3WalkExpr(pWalker,*(Expr **)&pUpsert->isDoUpdate);
    sqlite3WalkExprList(pWalker,(ExprList *)pUpsert->pToFree);
    if (pUpsert->pUpsertSrc != (SrcList *)0x0) {
      pSVar1 = pUpsert->pUpsertSrc;
      sqlite3WalkExprList(pWalker,*(ExprList **)pSVar1);
      sqlite3WalkExprList(pWalker,(ExprList *)pSVar1->a[0].zDatabase);
      sqlite3WalkExpr(pWalker,(Expr *)pSVar1->a[0].zName);
      sqlite3WalkExpr(pWalker,(Expr *)pSVar1->a[0].pSchema);
    }
    if (pUpsert->pNextUpsert != (Upsert *)0x0) {
      for (local_2c = 0; local_2c < *(int *)&pUpsert->pNextUpsert->pUpsertTarget;
          local_2c = local_2c + 1) {
        sqlite3WalkSelect(pWalker,*(Select **)
                                   ((long)pUpsert->pNextUpsert + (long)local_2c * 0x68 + 0x30));
      }
    }
  }
  return;
}

Assistant:

static void renameWalkTrigger(Walker *pWalker, Trigger *pTrigger){
  TriggerStep *pStep;

  /* Find tokens to edit in WHEN clause */
  sqlite3WalkExpr(pWalker, pTrigger->pWhen);

  /* Find tokens to edit in trigger steps */
  for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
    sqlite3WalkSelect(pWalker, pStep->pSelect);
    sqlite3WalkExpr(pWalker, pStep->pWhere);
    sqlite3WalkExprList(pWalker, pStep->pExprList);
    if( pStep->pUpsert ){
      Upsert *pUpsert = pStep->pUpsert;
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertTarget);
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertSet);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertWhere);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertTargetWhere);
    }
    if( pStep->pFrom ){
      int i;
      for(i=0; i<pStep->pFrom->nSrc; i++){
        sqlite3WalkSelect(pWalker, pStep->pFrom->a[i].pSelect);
      }
    }
  }
}